

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::Contains(S2Loop *this,S2Cell *target)

{
  bool bVar1;
  S2Point local_98;
  undefined4 local_80;
  uint64 local_6c;
  CellRelation local_64;
  undefined1 local_60 [4];
  CellRelation relation;
  Iterator it;
  S2Cell *target_local;
  S2Loop *this_local;
  
  it.end_._8_8_ = target;
  MutableS2ShapeIndex::Iterator::Iterator((Iterator *)local_60,&this->index_,UNPOSITIONED);
  local_6c = (uint64)S2Cell::id((S2Cell *)it.end_._8_8_);
  local_64 = MutableS2ShapeIndex::Iterator::Locate((Iterator *)local_60,(S2CellId)local_6c);
  if (local_64 == INDEXED) {
    bVar1 = BoundaryApproxIntersects(this,(Iterator *)local_60,(S2Cell *)it.end_._8_8_);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      S2Cell::GetCenter(&local_98,(S2Cell *)it.end_._8_8_);
      this_local._7_1_ = Contains(this,(Iterator *)local_60,&local_98);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  local_80 = 1;
  MutableS2ShapeIndex::Iterator::~Iterator((Iterator *)local_60);
  return this_local._7_1_;
}

Assistant:

bool S2Loop::Contains(const S2Cell& target) const {
  MutableS2ShapeIndex::Iterator it(&index_);
  S2ShapeIndex::CellRelation relation = it.Locate(target.id());

  // If "target" is disjoint from all index cells, it is not contained.
  // Similarly, if "target" is subdivided into one or more index cells then it
  // is not contained, since index cells are subdivided only if they (nearly)
  // intersect a sufficient number of edges.  (But note that if "target" itself
  // is an index cell then it may be contained, since it could be a cell with
  // no edges in the loop interior.)
  if (relation != S2ShapeIndex::INDEXED) return false;

  // Otherwise check if any edges intersect "target".
  if (BoundaryApproxIntersects(it, target)) return false;

  // Otherwise check if the loop contains the center of "target".
  return Contains(it, target.GetCenter());
}